

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O2

LengthPercentage
Rml::ComputeLengthPercentage
          (Property *property,float font_size,float document_font_size,float dp_ratio,
          Vector2f vp_dimensions)

{
  NumericValue value;
  bool bVar1;
  float fVar2;
  
  bVar1 = property->unit != PERCENT;
  if (bVar1) {
    value = Property::GetNumericValue(property);
    fVar2 = ComputeLength(value,font_size,document_font_size,dp_ratio,vp_dimensions);
  }
  else {
    fVar2 = Property::Get<float>(property);
  }
  return (LengthPercentage)((ulong)(uint)fVar2 << 0x20 | (ulong)!bVar1);
}

Assistant:

Style::LengthPercentage ComputeLengthPercentage(const Property* property, float font_size, float document_font_size, float dp_ratio,
	Vector2f vp_dimensions)
{
	using namespace Style;
	if (property->unit == Unit::PERCENT)
		return LengthPercentage(LengthPercentage::Percentage, property->Get<float>());

	return LengthPercentage(LengthPercentage::Length,
		ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions));
}